

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_edge_to_cellcenter
               (MultiFab *cc,int dcomp,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *edge,
               int ngrow)

{
  int iVar1;
  bool bVar2;
  int in_ESI;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *ezarr;
  Array4<const_double> *eyarr;
  Array4<const_double> *exarr;
  Array4<double> *ccarr;
  Box bx;
  MFIter mfi;
  BARef *i_00;
  MFIter *in_stack_fffffffffffffb80;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffba0;
  undefined1 do_tiling_;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *p_Var3;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  int iVar4;
  int local_448;
  int local_444;
  int in_stack_fffffffffffffbec;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffbf0;
  long local_400;
  long local_3f8;
  long local_3f0;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  long *local_3c0;
  undefined1 local_3b8 [136];
  MFIter *local_330;
  undefined1 local_328 [220];
  int local_24c;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_240;
  int local_238;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *local_230;
  int local_224;
  int iStack_220;
  int local_21c;
  undefined8 local_218;
  int local_210;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *local_208;
  int local_200;
  int iStack_1fc;
  int local_1f8;
  long *local_1f0;
  FabArray<amrex::FArrayBox> *local_1e8;
  MFIter *local_1e0;
  BARef *local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined4 local_1c4;
  int *local_1c0;
  undefined4 local_1b4;
  int *local_1b0;
  undefined4 local_1a4;
  int *local_1a0;
  undefined4 local_194;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *local_190;
  undefined4 local_184;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *local_180;
  undefined4 local_174;
  _Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  BARef *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  BARef *local_140;
  int local_134;
  int local_130;
  int local_12c;
  BARef *local_128;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  FabArray<amrex::FArrayBox> *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  FabArray<amrex::FArrayBox> *local_98;
  int local_8c;
  int local_88;
  int local_84;
  FabArray<amrex::FArrayBox> *local_80;
  int local_74;
  int local_70;
  int local_6c;
  FabArray<amrex::FArrayBox> *local_68;
  int local_5c;
  int local_58;
  int local_54;
  MFIter *local_50;
  int local_44;
  int local_40;
  int local_3c;
  MFIter *local_38;
  int local_2c;
  int local_28;
  int local_24;
  MFIter *local_20;
  int local_14;
  int local_10;
  int local_c;
  MFIter *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffba0 >> 0x38);
  local_24c = in_ESI;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_RDI,
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)(local_328 + 0x68)), bVar2) {
    p_Var3 = (_Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
              *)(local_328 + 0x4c);
    MFIter::growntilebox((MFIter *)in_stack_fffffffffffffbf0._M_head_impl,in_stack_fffffffffffffbec)
    ;
    i_00 = (BARef *)local_328;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_328._64_8_ = i_00;
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffffb80,(size_type)i_00);
    in_stack_fffffffffffffb80 = (MFIter *)(local_3b8 + 0x48);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_330 = in_stack_fffffffffffffb80;
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffffb80,(size_type)i_00);
    in_stack_fffffffffffffb88 = (FabArray<amrex::FArrayBox> *)local_3b8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_3b8._64_8_ = in_stack_fffffffffffffb88;
    Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffffb80,(size_type)i_00);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_174 = 0;
    local_224 = *(int *)&p_Var3->super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>;
    local_184 = 1;
    iStack_220 = *(int *)((long)&p_Var3->
                                 super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> +
                         4);
    in_stack_fffffffffffffbf0._M_head_impl =
         (p_Var3->super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>)._M_head_impl;
    local_194 = 2;
    local_238 = *(int *)&p_Var3[1].super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>
    ;
    local_1a0 = (int *)((long)(p_Var3 + 1) + 4);
    local_1a4 = 0;
    local_200 = *local_1a0;
    local_1b0 = (int *)((long)(p_Var3 + 1) + 4);
    local_1b4 = 1;
    iStack_1fc = *(int *)&p_Var3[2].
                          super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>;
    local_218 = *(undefined8 *)local_1a0;
    local_1c0 = (int *)((long)(p_Var3 + 1) + 4);
    local_1c4 = 2;
    local_210 = *(int *)((long)(p_Var3 + 2) + 4);
    for (local_444 = local_238; local_448 = iStack_220, local_444 <= local_210;
        local_444 = local_444 + 1) {
      for (; iVar1 = local_224, local_448 <= iStack_1fc; local_448 = local_448 + 1) {
        while (iVar4 = iVar1, iVar4 <= local_200) {
          local_1cc = local_448;
          local_1d0 = local_444;
          local_1d8 = (BARef *)local_328._64_8_;
          local_1e0 = local_330;
          local_1e8 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
          local_8 = local_330;
          local_10 = local_448;
          local_14 = local_444;
          local_20 = local_330;
          local_28 = local_448 + 1;
          local_2c = local_444;
          local_38 = local_330;
          local_40 = local_448;
          local_44 = local_444 + 1;
          local_50 = local_330;
          local_58 = local_448 + 1;
          local_5c = local_444 + 1;
          local_128 = (BARef *)local_328._64_8_;
          local_130 = local_448;
          local_134 = local_444;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_328._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_448 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (long)(local_444 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[1]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
           (long)local_24c * *(long *)(((Box *)(local_328._64_8_ + 0x18))->smallend).vect) * 8) =
               (*(double *)
                 ((long)&((local_330->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 ((long)(iVar4 - local_330->currentIndex) +
                  (long)(local_448 - local_330->beginIndex) * (long)local_330->fabArray +
                 (long)(local_444 - local_330->endIndex) * *(long *)(local_330->tile_size).vect) * 8
                 ) + *(double *)
                      ((long)&((local_330->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              _vptr_FabArrayBase +
                      ((long)(iVar4 - local_330->currentIndex) +
                       (long)(local_28 - local_330->beginIndex) * (long)local_330->fabArray +
                      (long)(local_444 - local_330->endIndex) * *(long *)(local_330->tile_size).vect
                      ) * 8) +
                *(double *)
                 ((long)&((local_330->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 ((long)(iVar4 - local_330->currentIndex) +
                  (long)(local_448 - local_330->beginIndex) * (long)local_330->fabArray +
                 (long)(local_44 - local_330->endIndex) * *(long *)(local_330->tile_size).vect) * 8)
               + *(double *)
                  ((long)&((local_330->m_fa)._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                          _vptr_FabArrayBase +
                  ((long)(iVar4 - local_330->currentIndex) +
                   (long)(local_58 - local_330->beginIndex) * (long)local_330->fabArray +
                  (long)(local_5c - local_330->endIndex) * *(long *)(local_330->tile_size).vect) * 8
                  )) * 0.25;
          local_68 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
          local_70 = local_448;
          local_74 = local_444;
          local_80 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
          local_84 = iVar4 + 1;
          local_88 = local_448;
          local_8c = local_444;
          local_98 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
          local_a0 = local_448;
          local_a4 = local_444 + 1;
          local_b0 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
          local_b4 = iVar4 + 1;
          local_b8 = local_448;
          local_bc = local_444 + 1;
          local_140 = (BARef *)local_328._64_8_;
          local_148 = local_448;
          local_14c = local_444;
          local_150 = local_24c + 1;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_328._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_448 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (long)(local_444 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[1]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
           (long)local_150 * *(long *)(((Box *)(local_328._64_8_ + 0x18))->smallend).vect) * 8) =
               (*(double *)
                 (*(long *)local_3b8._64_8_ +
                 ((long)(iVar4 - *(int *)(local_3b8._64_8_ + 0x20)) +
                  (long)(local_448 - *(int *)(local_3b8._64_8_ + 0x24)) *
                  *(long *)&((BoxArray *)(local_3b8._64_8_ + 8))->m_bat +
                 (long)(local_444 - *(int *)(local_3b8._64_8_ + 0x28)) *
                 *(long *)(local_3b8._64_8_ + 0x10)) * 8) +
                *(double *)
                 (*(long *)local_3b8._64_8_ +
                 ((long)(local_84 - *(int *)(local_3b8._64_8_ + 0x20)) +
                  (long)(local_448 - *(int *)(local_3b8._64_8_ + 0x24)) *
                  *(long *)&((BoxArray *)(local_3b8._64_8_ + 8))->m_bat +
                 (long)(local_444 - *(int *)(local_3b8._64_8_ + 0x28)) *
                 *(long *)(local_3b8._64_8_ + 0x10)) * 8) +
                *(double *)
                 (*(long *)local_3b8._64_8_ +
                 ((long)(iVar4 - *(int *)(local_3b8._64_8_ + 0x20)) +
                  (long)(local_448 - *(int *)(local_3b8._64_8_ + 0x24)) *
                  *(long *)&((BoxArray *)(local_3b8._64_8_ + 8))->m_bat +
                 (long)(local_a4 - *(int *)(local_3b8._64_8_ + 0x28)) *
                 *(long *)(local_3b8._64_8_ + 0x10)) * 8) +
               *(double *)
                (*(long *)local_3b8._64_8_ +
                ((long)(local_b4 - *(int *)(local_3b8._64_8_ + 0x20)) +
                 (long)(local_448 - *(int *)(local_3b8._64_8_ + 0x24)) *
                 *(long *)&((BoxArray *)(local_3b8._64_8_ + 8))->m_bat +
                (long)(local_bc - *(int *)(local_3b8._64_8_ + 0x28)) *
                *(long *)(local_3b8._64_8_ + 0x10)) * 8)) * 0.25;
          local_d0 = local_448;
          local_d4 = local_444;
          local_e4 = iVar4 + 1;
          local_e8 = local_448;
          local_ec = local_444;
          local_100 = local_448 + 1;
          local_104 = local_444;
          local_114 = iVar4 + 1;
          local_118 = local_448 + 1;
          local_11c = local_444;
          local_158 = (BARef *)local_328._64_8_;
          local_160 = local_448;
          local_164 = local_444;
          local_168 = local_24c + 2;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_328._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_448 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (long)(local_444 - (((Box *)(local_328._64_8_ + 0x18))->bigend).vect[1]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_328._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
           (long)local_168 * *(long *)(((Box *)(local_328._64_8_ + 0x18))->smallend).vect) * 8) =
               (*(double *)
                 (local_400 +
                 ((long)(iVar4 - local_3e0) + (local_448 - local_3dc) * local_3f8 +
                 (local_444 - local_3d8) * local_3f0) * 8) +
                *(double *)
                 (local_400 +
                 ((long)(local_e4 - local_3e0) + (local_448 - local_3dc) * local_3f8 +
                 (local_444 - local_3d8) * local_3f0) * 8) +
                *(double *)
                 (local_400 +
                 ((long)(iVar4 - local_3e0) + (local_100 - local_3dc) * local_3f8 +
                 (local_444 - local_3d8) * local_3f0) * 8) +
               *(double *)
                (local_400 +
                ((long)(local_114 - local_3e0) + (local_118 - local_3dc) * local_3f8 +
                (local_444 - local_3d8) * local_3f0) * 8)) * 0.25;
          local_1f0 = &local_400;
          local_1c8 = iVar4;
          local_15c = iVar4;
          local_144 = iVar4;
          local_12c = iVar4;
          local_110 = &local_400;
          local_fc = iVar4;
          local_f8 = &local_400;
          local_e0 = &local_400;
          local_cc = iVar4;
          local_c8 = &local_400;
          local_9c = iVar4;
          local_6c = iVar4;
          local_54 = iVar4;
          local_3c = iVar4;
          local_24 = iVar4;
          local_c = iVar4;
          iVar1 = iVar4 + 1;
        }
      }
    }
    local_3c0 = &local_400;
    local_240._M_t.
    super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
          )(__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
            )in_stack_fffffffffffffbf0._M_head_impl;
    local_230 = p_Var3;
    local_21c = local_238;
    local_208 = p_Var3;
    local_1f8 = local_210;
    local_190 = p_Var3;
    local_180 = p_Var3;
    local_170 = p_Var3;
    MFIter::operator++((MFIter *)(local_328 + 0x68));
  }
  MFIter::~MFIter(in_stack_fffffffffffffb80);
  return;
}

Assistant:

void average_edge_to_cellcenter (MultiFab& cc, int dcomp,
        const Vector<const MultiFab*>& edge, int ngrow)
    {
        AMREX_ASSERT(cc.nComp() >= dcomp + AMREX_SPACEDIM);
        AMREX_ASSERT(edge.size() == AMREX_SPACEDIM);
        AMREX_ASSERT(edge[0]->nComp() == 1);
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& exma = edge[0]->const_arrays();,
                         auto const& eyma = edge[1]->const_arrays();,
                         auto const& ezma = edge[2]->const_arrays(););
            ParallelFor(cc, IntVect(ngrow),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_eg_to_cc(i, j, k, ccma[box_no],
                                   AMREX_D_DECL(exma[box_no], eyma[box_no], ezma[box_no]),
                                   dcomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& exarr = edge[0]->const_array(mfi);,
                             Array4<Real const> const& eyarr = edge[1]->const_array(mfi);,
                             Array4<Real const> const& ezarr = edge[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_eg_to_cc(i, j, k, ccarr, AMREX_D_DECL(exarr,eyarr,ezarr), dcomp);
                });
            }
        }
    }